

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

bool __thiscall
kj::ArrayPtr<const_kj::StringPtr>::operator<
          (ArrayPtr<const_kj::StringPtr> *this,ArrayPtr<const_kj::StringPtr> *other)

{
  bool bVar1;
  byte bVar2;
  long lVar4;
  size_t i;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar3;
  
  uVar3 = this->size_;
  uVar7 = other->size_;
  if (uVar3 < other->size_) {
    uVar7 = uVar3;
  }
  lVar4 = 0;
  lVar6 = 0;
  uVar5 = 0;
  do {
    bVar2 = (byte)uVar3;
    if (uVar7 == uVar5) {
LAB_0011c4f6:
      if (uVar7 <= uVar5) {
        bVar2 = this->size_ < other->size_;
      }
      return (bool)(bVar2 & 1);
    }
    bVar1 = ArrayPtr<const_char>::operator==
                      ((ArrayPtr<const_char> *)((long)&(this->ptr->content).ptr + lVar4),
                       (ArrayPtr<const_char> *)((long)&(other->ptr->content).ptr + lVar4));
    uVar3 = (ulong)bVar1;
    if (!bVar1) {
      bVar2 = ArrayPtr<const_char>::operator<
                        ((ArrayPtr<const_char> *)((long)this->ptr - lVar6),
                         (ArrayPtr<const_char> *)((long)other->ptr - lVar6));
      goto LAB_0011c4f6;
    }
    uVar5 = uVar5 + 1;
    lVar6 = lVar6 + -0x10;
    lVar4 = lVar4 + 0x10;
  } while( true );
}

Assistant:

inline constexpr bool operator<(const ArrayPtr& other) const {
    size_t comparisonSize = kj::min(size_, other.size_);
    if constexpr (isSameType<RemoveConst<T>, char>() || isSameType<RemoveConst<T>, unsigned char>()) {
#if KJ_HAS_COMPILER_FEATURE(cxx_constexpr_string_builtins)
      int ret = __builtin_memcmp(ptr, other.ptr, comparisonSize * sizeof(T));
      if (ret != 0) {
        return ret < 0;
      }
#else
      for (size_t i = 0; i < comparisonSize; ++i) {
        if (static_cast<unsigned char>(ptr[i]) != static_cast<unsigned char>(other.ptr[i])) {
          return static_cast<unsigned char>(ptr[i]) < static_cast<unsigned char>(other.ptr[i]);
        }
      }
#endif
    } else {
      for (size_t i = 0; i < comparisonSize; i++) {
        bool ret = ptr[i] == other.ptr[i];
        if (!ret) {
          return ptr[i] < other.ptr[i];
        }
      }
    }
    // arrays are equal up to comparisonSize
    return size_ < other.size_;
  }